

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

ArgIface * __thiscall Args::Command::findArgument(Command *this,String *n)

{
  __type _Var1;
  ArgIface *in_RDI;
  string local_38 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  ArgIface *local_8;
  
  (*in_RDI->_vptr_ArgIface[3])(local_38);
  _Var1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_38);
  local_8 = in_RDI;
  if (!_Var1) {
    local_8 = (ArgIface *)0x0;
  }
  return local_8;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & n ) override
	{
		if( name() == n )
			return this;
		else
			return nullptr;
	}